

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d00101::ConstPubkeyProvider::ToPrivateString
          (ConstPubkeyProvider *this,SigningProvider *arg,string *ret)

{
  bool bVar1;
  reference pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CKeyID *keyid;
  vector<CKeyID,_std::allocator<CKeyID>_> *__range3;
  iterator __end3;
  iterator __begin3;
  CKey key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  CPubKey *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  XOnlyPubKey *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  iterator in_stack_ffffffffffffff70;
  undefined1 local_70 [52];
  undefined1 local_3c [52];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CKey::CKey((CKey *)in_stack_fffffffffffffef8);
  if ((in_RDI[2]._M_string_length & 0x10000000000) == 0) {
    __str = in_RSI;
    CPubKey::GetID((CPubKey *)in_RDI);
    (**(code **)((in_RSI->_M_dataplus)._M_p + 0x28))(in_RSI,local_3c,local_70);
  }
  else {
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff00);
    XOnlyPubKey::GetKeyIDs(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff70 =
         std::vector<CKeyID,_std::allocator<CKeyID>_>::begin
                   ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_ffffffffffffff00);
    std::vector<CKeyID,_std::allocator<CKeyID>_>::end
              ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_ffffffffffffff00);
    while (bVar1 = __gnu_cxx::operator==<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                             ((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff0f,
                                          CONCAT16(in_stack_ffffffffffffff0e,
                                                   in_stack_ffffffffffffff08)),
                              (__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                               *)in_stack_ffffffffffffff00), __str = in_RSI,
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pCVar2 = __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
               ::operator*((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                            *)in_stack_fffffffffffffef8);
      (**(code **)((in_RSI->_M_dataplus)._M_p + 0x28))(in_RSI,pCVar2,local_70);
      bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffffef8);
      __str = in_RSI;
      if (bVar1) break;
      __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
      operator++((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *)
                 in_stack_fffffffffffffef8);
    }
    std::vector<CKeyID,_std::allocator<CKeyID>_>::~vector
              ((vector<CKeyID,_std::allocator<CKeyID>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
  }
  bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffffef8);
  if (bVar1) {
    EncodeSecret_abi_cxx11_((CKey *)in_stack_ffffffffffffff70._M_current);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,__str);
    std::__cxx11::string::~string(in_stack_fffffffffffffef8);
  }
  CKey::~CKey((CKey *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& ret) const override
    {
        CKey key;
        if (m_xonly) {
            for (const auto& keyid : XOnlyPubKey(m_pubkey).GetKeyIDs()) {
                arg.GetKey(keyid, key);
                if (key.IsValid()) break;
            }
        } else {
            arg.GetKey(m_pubkey.GetID(), key);
        }
        if (!key.IsValid()) return false;
        ret = EncodeSecret(key);
        return true;
    }